

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O2

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  uint uVar1;
  int iVar2;
  size_t *in_RDX;
  ulong uVar3;
  ulong uVar4;
  char *__assertion;
  ulong uVar5;
  bool bVar6;
  size_t n;
  Status local_48;
  ulong local_40;
  Status local_38;
  
  n = *in_RDX;
  uVar5 = in_RDX[1];
  this->dest_ = (WritableFile *)0x0;
  bVar6 = true;
  do {
    iVar2 = (int)slice->size_;
    if (0x8000 < iVar2) {
      __assertion = "leftover >= 0";
      uVar1 = 0x2f;
LAB_0010e5c2:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/log_writer.cc"
                    ,uVar1,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    if (0x7ff9 < iVar2) {
      if (iVar2 != 0x8000) {
        local_40 = (ulong)(0x8000 - iVar2);
        local_48.state_ = "";
        (**(code **)(*(long *)slice->data_ + 0x10))(&local_38,slice->data_,&local_48);
        Status::~Status(&local_38);
      }
      *(undefined4 *)&slice->size_ = 0;
      iVar2 = 0;
    }
    if ((int)(0x7ff9U - iVar2) < 0) {
      __assertion = "kBlockSize - block_offset_ - kHeaderSize >= 0";
      uVar1 = 0x3b;
      goto LAB_0010e5c2;
    }
    uVar3 = (ulong)(0x7ff9U - iVar2);
    uVar4 = uVar3;
    if (uVar5 < uVar3) {
      uVar4 = uVar5;
    }
    uVar1 = (uVar3 < uVar5) + 1;
    if (!bVar6) {
      uVar1 = 4 - (uVar3 < uVar5);
    }
    EmitPhysicalRecord((Writer *)&local_48,(RecordType)slice,(char *)(ulong)uVar1,n);
    Status::operator=((Status *)this,&local_48);
    Status::~Status(&local_48);
    if (this->dest_ != (WritableFile *)0x0) {
      return (Status)(char *)this;
    }
    n = n + uVar4;
    bVar6 = false;
    uVar5 = uVar5 - uVar4;
    if (uVar5 == 0) {
      return (Status)(char *)this;
    }
  } while( true );
}

Assistant:

Status Writer::AddRecord(const Slice &slice) {
            const char *ptr = slice.data();
            size_t left = slice.size();

            // Fragment the record if necessary and emit it.  Note that if slice
            // is empty, we still want to iterate once to emit a single
            // zero-length record
            Status s;
            bool begin = true;
            do {
                const int leftover = kBlockSize - block_offset_;
                assert(leftover >= 0);
                if (leftover < kHeaderSize) {
                    // Switch to a new block
                    if (leftover > 0) {
                        // Fill the trailer (literal below relies on kHeaderSize being 7)
                        assert(kHeaderSize == 7);
                        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
                    }
                    block_offset_ = 0;
                }

                // Invariant: we never leave < kHeaderSize bytes in a block.
                assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

                const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
                const size_t fragment_length = (left < avail) ? left : avail;

                RecordType type;
                const bool end = (left == fragment_length);
                if (begin && end) {
                    type = kFullType;
                } else if (begin) {
                    type = kFirstType;
                } else if (end) {
                    type = kLastType;
                } else {
                    type = kMiddleType;
                }

                s = EmitPhysicalRecord(type, ptr, fragment_length);
                ptr += fragment_length;
                left -= fragment_length;
                begin = false;
            } while (s.ok() && left > 0);
            return s;
        }